

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O1

int test_auth_pubkey(LIBSSH2_SESSION *session,int flags,char *username,char *password,char *fn_pub,
                    char *fn_priv)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  FILE *__stream;
  void *__ptr;
  size_t sVar6;
  
  iVar2 = openssh_fixture_have_docker();
  if (((iVar2 == 0) && (iVar2 = strcmp(username,"libssh2"), iVar2 == 0)) &&
     (username = getenv("USER"), username == (char *)0x0)) {
    username = getenv("LOGNAME");
  }
  sVar3 = strlen(username);
  pcVar4 = (char *)libssh2_userauth_list(session,username,sVar3 & 0xffffffff);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "libssh2_userauth_list";
    goto LAB_00102eea;
  }
  pcVar5 = strstr(pcVar4,"publickey");
  if (pcVar5 == (char *)0x0) {
    fprintf(_stderr,"\'publickey\' was expected in userauth list: %s\n",pcVar4);
    return 1;
  }
  if ((flags & 2U) == 0) {
    sVar3 = strlen(username);
    pcVar4 = srcdir_path(fn_pub);
    pcVar5 = srcdir_path(fn_priv);
    iVar2 = libssh2_userauth_publickey_fromfile_ex
                      (session,username,sVar3 & 0xffffffff,pcVar4,pcVar5,password);
  }
  else {
    pcVar4 = srcdir_path(fn_priv);
    __stream = fopen(pcVar4,"r");
    if (__stream == (FILE *)0x0) {
      pcVar5 = "File could not be read: %s\n";
LAB_00102e7a:
      fprintf(_stderr,pcVar5,pcVar4);
LAB_00102e94:
      __ptr = (void *)0x0;
      sVar3 = 0;
      bVar1 = false;
    }
    else {
      fseek(__stream,0,2);
      sVar3 = ftell(__stream);
      if ((long)sVar3 < 0) {
        fclose(__stream);
        pcVar5 = "Could not determine input size of: %s\n";
        goto LAB_00102e7a;
      }
      rewind(__stream);
      __ptr = calloc(1,sVar3 + 1);
      if (__ptr == (void *)0x0) {
        test_auth_pubkey_cold_2();
        goto LAB_00102e94;
      }
      sVar6 = fread(__ptr,sVar3,1,__stream);
      fclose(__stream);
      bVar1 = true;
      if (sVar6 != 1) {
        test_auth_pubkey_cold_1();
        goto LAB_00102e94;
      }
    }
    if (!bVar1) {
      test_auth_pubkey_cold_3();
      return 1;
    }
    sVar6 = strlen(username);
    iVar2 = libssh2_userauth_publickey_frommemory(session,username,sVar6,0,0,__ptr,sVar3,0);
    free(__ptr);
  }
  if ((flags & 1U) != 0) {
    if (iVar2 == 0) {
      test_auth_pubkey_cold_4();
      return 1;
    }
    return 0;
  }
  if (iVar2 == 0) {
    return 0;
  }
  pcVar4 = "libssh2_userauth_publickey_fromfile_ex";
LAB_00102eea:
  print_last_session_error(pcVar4);
  return 1;
}

Assistant:

int test_auth_pubkey(LIBSSH2_SESSION *session, int flags,
                     const char *username,
                     const char *password,
                     const char *fn_pub,
                     const char *fn_priv)
{
    int rc;
    const char *userauth_list;

    /* Ignore our hard-wired Dockerfile user when not running under Docker */
    if(!openssh_fixture_have_docker() && strcmp(username, "libssh2") == 0) {
        username = getenv("USER");
        if(!username) {
#ifdef _WIN32
            username = getenv("USERNAME");
#else
            username = getenv("LOGNAME");
#endif
        }
    }

    userauth_list = libssh2_userauth_list(session, username,
                                          (unsigned int)strlen(username));
    if(!userauth_list) {
        print_last_session_error("libssh2_userauth_list");
        return 1;
    }

    if(!strstr(userauth_list, "publickey")) {
        fprintf(stderr, "'publickey' was expected in userauth list: %s\n",
                userauth_list);
        return 1;
    }

    if((flags & TEST_AUTH_FROMMEM) != 0) {
        char *buffer = NULL;
        size_t len = 0;

        if(read_file(srcdir_path(fn_priv), &buffer, &len)) {
            fprintf(stderr, "Reading key file failed.\n");
            return 1;
        }

        rc = libssh2_userauth_publickey_frommemory(session,
                                                   username, strlen(username),
                                                   NULL, 0,
                                                   buffer, len,
                                                   NULL);

        free(buffer);
    }
    else {
        rc = libssh2_userauth_publickey_fromfile_ex(session, username,
                                                (unsigned int)strlen(username),
                                                    srcdir_path(fn_pub),
                                                    srcdir_path(fn_priv),
                                                    password);
    }

    if((flags & TEST_AUTH_SHOULDFAIL) != 0) {
        if(rc == 0) {
            fprintf(stderr, "Public-key auth succeeded with wrong key\n");
            return 1;
        }
    }
    else {
        if(rc) {
            print_last_session_error("libssh2_userauth_publickey_fromfile_ex");
            return 1;
        }
    }

    return 0;
}